

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O0

char ** apprun_shell_split_arguments(char *str)

{
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  bool bVar5;
  char local_438 [7];
  _Bool consumed;
  char buffer [1024];
  char *end;
  char *begin;
  uint split_count;
  char **splits;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(str);
    str_local = (char *)calloc(sVar2 + 1,8);
    begin._4_4_ = 0;
    buffer._1016_8_ = str;
    memset(local_438,0,0x400);
    end = str;
    while (*end != '\0') {
      pcVar3 = apprun_string_consume_spaces(end);
      bVar5 = *pcVar3 == '\\';
      if (bVar5) {
        strncat(local_438,pcVar3 + 1,1);
        buffer._1016_8_ = pcVar3 + 2;
      }
      else if (*pcVar3 == '\'') {
        buffer._1016_8_ = apprun_string_consume_until(pcVar3 + 1,"\'");
        strncat(local_438,pcVar3 + 1,(size_t)(buffer._1016_8_ + (-1 - (long)pcVar3)));
        bVar5 = true;
        buffer._1016_8_ = buffer._1016_8_ + 1;
      }
      if ((!bVar5) && (*pcVar3 == '\"')) {
        buffer._1016_8_ = apprun_string_consume_until(pcVar3 + 1,"\"");
        strncat(local_438,pcVar3 + 1,(size_t)(buffer._1016_8_ + (-1 - (long)pcVar3)));
        bVar5 = true;
        buffer._1016_8_ = buffer._1016_8_ + 1;
      }
      if ((((!bVar5) && (*pcVar3 != '\'')) && (*pcVar3 != '\"')) && (*pcVar3 != '\\')) {
        buffer._1016_8_ = apprun_string_consume_until(pcVar3,"\"\'\\ \t");
        strncat(local_438,pcVar3,buffer._1016_8_ - (long)pcVar3);
      }
      ppuVar4 = __ctype_b_loc();
      if ((((*ppuVar4)[(int)*(char *)buffer._1016_8_] & 0x2000) != 0) ||
         (*(char *)buffer._1016_8_ == '\0')) {
        _Var1 = apprun_string_is_all_blanks(local_438);
        if (!_Var1) {
          pcVar3 = apprun_string_trim(local_438);
          *(char **)(str_local + (ulong)begin._4_4_ * 8) = pcVar3;
          begin._4_4_ = begin._4_4_ + 1;
        }
        memset(local_438,0,0x400);
      }
      end = (char *)buffer._1016_8_;
    }
  }
  return (char **)str_local;
}

Assistant:

char **apprun_shell_split_arguments(char const *str) {
    if (str == NULL)
        return NULL;

    static const char single_quote_delimiter[] = "\'";
    static const char double_quote_delimiter[] = "\"";
    static const char regular_quote_delimiter[] = "\"\'\\ \t";

    char **splits = calloc(strlen(str) + 1, sizeof(char *));
    unsigned split_count = 0;

    const char *begin = str;
    const char *end = str;
    char buffer[1024] = {0x0};

    while (*begin != '\0') {
        begin = apprun_string_consume_spaces(begin);
        bool consumed = false;

        if (*begin == '\\') {
            strncat(buffer, begin + 1, 1);
            end = begin + 2;
            consumed = true;
        }

        if (!consumed && *begin == '\'') {
            end = apprun_string_consume_until(begin + 1, single_quote_delimiter);
            strncat(buffer, begin + 1, end - begin - 1);
            consumed = true;

            end++;
        }

        if (!consumed && *begin == '\"') {
            end = apprun_string_consume_until(begin + 1, double_quote_delimiter);
            strncat(buffer, begin + 1, end - begin - 1);
            consumed = true;

            end++;
        }

        if (!consumed && *begin != '\'' && *begin != '\"' && *begin != '\\') {
            end = apprun_string_consume_until(begin, regular_quote_delimiter);
            strncat(buffer, begin, end - begin);
        }

        if (isspace(*end) || *end == 0) {
            if (!apprun_string_is_all_blanks(buffer)) {
                splits[split_count] = apprun_string_trim(buffer);
                split_count++;
            }

            memset(buffer, 0, 1024);
        }

        begin = end;
    }

    return splits;
}